

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

bool __thiscall AmpIO::ReadEncoderPreload(AmpIO *this,uint index,int32_t *sdata)

{
  BasePort *pBVar1;
  char cVar2;
  int iVar3;
  uint32_t read_data;
  int32_t local_c;
  
  pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
  cVar2 = '\0';
  if ((pBVar1 != (BasePort *)0x0) && (cVar2 = '\0', index < this->NumEncoders)) {
    iVar3 = (*pBVar1->_vptr_BasePort[0x23])
                      (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                       (ulong)(index * 0x10 + 0x14),&local_c);
    cVar2 = (char)iVar3;
    if (cVar2 != '\0') {
      *sdata = local_c;
    }
  }
  return (bool)cVar2;
}

Assistant:

bool AmpIO::ReadEncoderPreload(unsigned int index, int32_t &sdata) const
{
    bool ret = false;
    if (port && (index < NumEncoders)) {
        uint32_t read_data;
        unsigned int channel = (index+1) << 4;
        ret = port->ReadQuadlet(BoardId, channel | ENC_LOAD_REG, read_data);
        if (ret) sdata = static_cast<int32_t>(read_data);
    }
    return ret;
}